

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O0

MPP_RET __thiscall MppClusterServer::put(MppClusterServer *this,MppClientType client_type)

{
  MppCluster *ptr;
  MppCluster *p;
  AutoMutex auto_lock;
  RK_S32 i;
  MppClientType client_type_local;
  MppClusterServer *this_local;
  
  if ((int)client_type < 0x1e) {
    auto_lock.mLock._4_4_ = client_type;
    Mutex::Autolock::Autolock((Autolock *)&p,&this->super_Mutex,1);
    ptr = this->mClusters[auto_lock.mLock._4_4_];
    if (ptr == (MppCluster *)0x0) {
      this_local._4_4_ = MPP_NOK;
    }
    else {
      for (auto_lock.mLock._0_4_ = 0; (int)auto_lock.mLock < ptr->worker_count;
          auto_lock.mLock._0_4_ = (int)auto_lock.mLock + 1) {
        cluster_worker_deinit(ptr->worker + (int)auto_lock.mLock);
      }
      if ((mpp_cluster_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_cluster","put %s\n",(char *)0x0,ptr);
      }
      mpp_osal_free("put",ptr);
      this_local._4_4_ = MPP_OK;
    }
    Mutex::Autolock::~Autolock((Autolock *)&p);
  }
  else {
    this_local._4_4_ = MPP_NOK;
  }
  return this_local._4_4_;
}

Assistant:

MPP_RET MppClusterServer::put(MppClientType client_type)
{
    RK_S32 i;

    if (client_type >= VPU_CLIENT_BUTT)
        return MPP_NOK;

    AutoMutex auto_lock(this);
    MppCluster *p = mClusters[client_type];

    if (!p)
        return MPP_NOK;

    for (i = 0; i < p->worker_count; i++)
        cluster_worker_deinit(&p->worker[i]);

    cluster_dbg_flow("put %s\n", p->name);

    mpp_free(p);

    return MPP_OK;
}